

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlsavoCtrl.cpp
# Opt level: O1

void __thiscall
AlsavoSession::Connect
          (AlsavoSession *this,string *serverIP,int16_t serverPort,string *serial,string *passwd)

{
  ConnectionStatus CVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint uVar4;
  int iVar5;
  Verbosity VVar6;
  time_t tVar7;
  ulong uVar8;
  rep rVar9;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  uchar respdata [16];
  AuthResponse resp;
  AuthIntro intro;
  char rcvBuf [512];
  MD5_CTX ctx;
  ConnectionStatus local_350 [2];
  undefined8 local_348;
  undefined8 uStack_340;
  undefined4 local_32c;
  undefined8 local_328;
  undefined8 local_320;
  undefined8 local_318;
  undefined8 uStack_310;
  Timestamp local_308;
  undefined1 local_300;
  undefined7 local_2ff;
  undefined4 uStack_2f8;
  undefined8 local_2f4;
  uint32_t local_2ec;
  uint64_t local_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  Timestamp local_2d0;
  char local_2c8 [4];
  uint32_t local_2c4;
  uint32_t local_2c0;
  undefined4 local_2b8;
  uint32_t local_2b4;
  MD5_CTX local_c8;
  
  std::__cxx11::string::_M_assign((string *)&this->m_SerialNo);
  std::__cxx11::string::_M_assign((string *)&this->m_Password);
  tVar7 = time((time_t *)0x0);
  srand((uint)tVar7);
  MD5_Init(&local_c8);
  MD5_Update(&local_c8,(this->m_Password)._M_dataplus._M_p,
             (ulong)(uint)(this->m_Password)._M_string_length);
  MD5_Final(this->m_HashedPW,&local_c8);
  (this->m_DestAddr).sin_family = 0;
  (this->m_DestAddr).sin_port = 0;
  (this->m_DestAddr).sin_addr = 0;
  (this->m_DestAddr).sin_zero[0] = '\0';
  (this->m_DestAddr).sin_zero[1] = '\0';
  (this->m_DestAddr).sin_zero[2] = '\0';
  (this->m_DestAddr).sin_zero[3] = '\0';
  (this->m_DestAddr).sin_zero[4] = '\0';
  (this->m_DestAddr).sin_zero[5] = '\0';
  (this->m_DestAddr).sin_zero[6] = '\0';
  (this->m_DestAddr).sin_zero[7] = '\0';
  (this->m_DestAddr).sin_family = 2;
  (this->m_DestAddr).sin_port = serverPort << 8 | (ushort)serverPort >> 8;
  inet_pton(2,(serverIP->_M_dataplus)._M_p,&(this->m_DestAddr).sin_addr);
  uVar8 = atoll((serial->_M_dataplus)._M_p);
  this->m_SerialQ =
       uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
       (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
       (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
  Disconnect(this);
  uVar4 = rand();
  iVar5 = rand();
  this->m_ClientToken = iVar5 << 0x10 | uVar4;
  iVar5 = socket(2,2,0);
  this->m_Sock = iVar5;
  VVar6 = loguru::current_verbosity_cutoff();
  if (-1 < VVar6) {
    loguru::log((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  }
  local_2ec = this->m_ClientToken;
  local_2e8 = this->m_SerialQ;
  local_300 = 0x32;
  local_2ff = 0;
  uStack_2f8 = 0;
  local_2f4 = 0x201012800f200;
  local_2e0 = 0xd3e2eeacffffffff;
  uStack_2d8 = 0x6afdc75500000000;
  Timestamp::Now(&local_2d0);
  sendto(this->m_Sock,&local_300,0x38,0,(sockaddr *)&this->m_DestAddr,0x10);
  iVar5 = RecvWithTimeout(this,local_2c8,0x200,2000);
  if (iVar5 == 0) {
    iVar5 = loguru::current_verbosity_cutoff();
    uVar2 = extraout_XMM0_Da_02;
    uVar3 = extraout_XMM0_Db_02;
  }
  else if (((((char)local_2b8 == '\x03') && (local_2b8._1_1_ == '\0')) && (local_2b8._2_1_ == '\0'))
          && (local_2b8._3_1_ == '\0')) {
    this->m_CSID = local_2c4;
    this->m_DSID = local_2c0;
    this->m_ServerToken = local_2b4;
    VVar6 = loguru::current_verbosity_cutoff();
    if (-1 < VVar6) {
      loguru::log((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
    }
    MD5_Init(&local_c8);
    MD5_Update(&local_c8,&this->m_ClientToken,4);
    MD5_Update(&local_c8,&this->m_ServerToken,4);
    MD5_Update(&local_c8,this->m_HashedPW,0x10);
    MD5_Final((uchar *)&local_348,&local_c8);
    local_328._0_4_ = this->m_CSID;
    local_328._4_4_ = this->m_DSID;
    local_32c = 0x32;
    local_320 = 0x30000041c00f200;
    Timestamp::Now(&local_308);
    local_318 = local_348;
    uStack_310 = uStack_340;
    sendto(this->m_Sock,&local_32c,0x2c,0,(sockaddr *)&this->m_DestAddr,0x10);
    iVar5 = RecvWithTimeout(this,local_2c8,0x200,2000);
    if (iVar5 == 0) {
      iVar5 = loguru::current_verbosity_cutoff();
      uVar2 = extraout_XMM0_Da_04;
      uVar3 = extraout_XMM0_Db_04;
    }
    else {
      if (local_2b8 == 5) {
        rVar9 = std::chrono::_V2::system_clock::now();
        (this->m_LastPacketRcvTime).__d.__r = rVar9;
        CVar1 = this->m_ConnectionStatus;
        this->m_ConnectionStatus = Connected;
        if (CVar1 != Connected &&
            (this->m_ConnStatusCB).super__Function_base._M_manager != (_Manager_type)0x0) {
          local_350[1] = 1;
          local_350[0] = CVar1;
          (*(this->m_ConnStatusCB)._M_invoker)
                    ((_Any_data *)&this->m_ConnStatusCB,local_350 + 1,local_350);
        }
        VVar6 = loguru::current_verbosity_cutoff();
        if (VVar6 < 0) {
          return;
        }
        loguru::log((double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
        return;
      }
      iVar5 = loguru::current_verbosity_cutoff();
      uVar2 = extraout_XMM0_Da_05;
      uVar3 = extraout_XMM0_Db_05;
    }
  }
  else {
    iVar5 = loguru::current_verbosity_cutoff();
    uVar2 = extraout_XMM0_Da_03;
    uVar3 = extraout_XMM0_Db_03;
  }
  if (-3 < iVar5) {
    loguru::log((double)CONCAT44(uVar3,uVar2));
  }
  Disconnect(this);
  return;
}

Assistant:

void Connect(const std::string serverIP, int16_t serverPort, const std::string &serial, const std::string &passwd)
	{
		m_SerialNo = serial;
		m_Password = passwd;

		srand((uint32_t)time(NULL));

		MD5_CTX ctx;
		MD5_Init(&ctx);
		MD5_Update(&ctx, (char*)m_Password.c_str(), (unsigned int)m_Password.length());
		MD5_Final(m_HashedPW, &ctx);

		memset(&m_DestAddr, 0, sizeof(sockaddr_in));
		m_DestAddr.sin_family = AF_INET;
		m_DestAddr.sin_port = htons(serverPort);
		inet_pton(AF_INET, serverIP.c_str(), &m_DestAddr.sin_addr);
		int64_t s = atoll(serial.c_str());
		m_SerialQ = htonll(s);

		Disconnect();

		m_ClientToken = rand() | (rand() << 16);
		m_Sock = socket(AF_INET, SOCK_DGRAM, 0);

		char rcvBuf[512];

		LOG_F(INFO, "Connecting to %s:%d...", serverIP.c_str(), serverPort);

		AuthIntro intro(m_ClientToken, m_SerialQ);
		sendto(m_Sock, (const char*)&intro, 56, 0, (sockaddr*)&m_DestAddr, sizeof(m_DestAddr));
		
		int bytesReceived = RecvWithTimeout(rcvBuf, sizeof(rcvBuf), 2000);

		if (bytesReceived == 0)
		{
			LOG_F(ERROR, "Server not responding, disconnecting");
			Disconnect();
			return;
		}

		AuthChallenge* challenge = (AuthChallenge*)rcvBuf;

		if (!(challenge->act1 == 3 && challenge->act2 == 0 && challenge->act3 == 0 && challenge->act4 == 0))
		{
			LOG_F(ERROR, "Invalid auth challenge packet (pump offline?), disconnecting");
			Disconnect();
			return;
		}

		m_CSID = challenge->hdr.csid;
		m_DSID = challenge->hdr.dsid;
		m_ServerToken = challenge->serverToken;

		LOG_F(INFO, "Received handshake, CSID=%08X, DSID=%08X, server token %08X", m_CSID, m_DSID, m_ServerToken);

		MD5_Init(&ctx);
		MD5_Update(&ctx, &m_ClientToken, 4);
		MD5_Update(&ctx, &m_ServerToken, 4);
		MD5_Update(&ctx, m_HashedPW, 16);

		unsigned char respdata[16];
		MD5_Final(respdata, &ctx);

		AuthResponse resp(m_CSID, m_DSID, respdata);
		sendto(m_Sock, (const char*)&resp, sizeof(resp), 0, (sockaddr*)&m_DestAddr, sizeof(m_DestAddr));

		bytesReceived = RecvWithTimeout(rcvBuf, sizeof(rcvBuf), 2000);

		if (bytesReceived == 0)
		{
			LOG_F(ERROR, "Server not responding to auth response, disconnecting");
			Disconnect();
			return;
		}

		uint32_t act = *(uint32_t*)(&rcvBuf[sizeof(PacketHeader)]);
		if (act != 0x00000005)
		{
			LOG_F(ERROR, "Server returned error in auth, disconnecting");
			Disconnect();
			return;

		}
		m_LastPacketRcvTime = std::chrono::system_clock::now();
		UpdateConnectionStatus(ConnectionStatus::Connected);

		LOG_F(INFO, "Connection complete.");

		return;
	}